

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcSpaceType::IfcSpaceType(IfcSpaceType *this)

{
  IfcSpaceType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1c0,"IfcSpaceType");
  IfcSpatialStructureElementType::IfcSpatialStructureElementType
            ((IfcSpatialStructureElementType *)this,&PTR_construction_vtable_24__00f67440);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceType,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceType,_1UL>,
             &PTR_construction_vtable_24__00f67578);
  *(undefined8 *)this = 0xf67310;
  *(undefined8 *)&this->field_0x1c0 = 0xf67428;
  *(undefined8 *)&this->field_0x88 = 0xf67338;
  *(undefined8 *)&this->field_0x98 = 0xf67360;
  *(undefined8 *)&this->field_0xf0 = 0xf67388;
  *(undefined8 *)&this->field_0x148 = 0xf673b0;
  *(undefined8 *)&this->field_0x180 = 0xf673d8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0xf67400;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceType,_1UL>).field_0x10);
  return;
}

Assistant:

IfcSpaceType() : Object("IfcSpaceType") {}